

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MPIShmChain.cpp
# Opt level: O2

void __thiscall adios2::aggregator::MPIShmChain::DestroyShm(MPIShmChain *this)

{
  string local_28;
  
  local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
  local_28._M_string_length = 0;
  local_28.field_2._M_local_buf[0] = '\0';
  helper::Comm::Win_free(&(this->super_MPIAggregator).m_Comm,&this->m_Win,&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void MPIShmChain::DestroyShm() { m_Comm.Win_free(m_Win); }